

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArgumentsTest.cpp
# Opt level: O3

Utest * __thiscall
TEST_CommandLineArguments_setExcludeStrictGroupFilter_TestShell::createTest
          (TEST_CommandLineArguments_setExcludeStrictGroupFilter_TestShell *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(0x18,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
                                  ,0x149);
  this_00->_vptr_Utest = (_func_int **)0x0;
  this_00[1]._vptr_Utest = (_func_int **)0x0;
  this_00[2]._vptr_Utest = (_func_int **)0x0;
  Utest::Utest(this_00);
  this_00->_vptr_Utest = (_func_int **)&PTR__Utest_003412c0;
  return this_00;
}

Assistant:

TEST(CommandLineArguments, setExcludeStrictGroupFilter)
{
    int argc = 3;
    const char* argv[] = { "tests.exe", "-xsg", "group" };
    CHECK(newArgumentParser(argc, argv));
    TestFilter groupFilter("group");
    groupFilter.invertMatching();
    groupFilter.strictMatching();
    CHECK_EQUAL(groupFilter, *args->getGroupFilters());
}